

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::
     MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (ostream *os,char *indicator,char *name,char *name1,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *value1,char *name2,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               value2)

{
  char *pcVar1;
  char buf [81];
  
  if (indicator == (char *)0x0) {
    indicator = "";
  }
  pcVar1 = "";
  if (name != (char *)0x0) {
    pcVar1 = name;
  }
  spxSnprintf(buf,0x51," %-2.2s %-8.8s",indicator,pcVar1);
  std::operator<<(os,buf);
  if (name1 != (char *)0x0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
              (&value1->m_backend);
    spxSnprintf(buf,0x51,"%-8.8s  %.15lf",name1);
    std::operator<<(os,buf);
    if (name2 != (char *)0x0) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                ((cpp_dec_float<200U,_int,_void> *)value2.m_backend.data._M_elems._0_8_);
      spxSnprintf(buf,0x51,"   %-8.8s  %.15lf",name2);
      std::operator<<(os,buf);
    }
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

static void MPSwriteRecord(
   std::ostream&  os,
   const char*    indicator,
   const char*    name,
   const char*    name1  = nullptr,
   const R     value1 = 0.0,
   const char*    name2  = nullptr,
   const R     value2 = 0.0
)
{
   char buf[81];

   spxSnprintf(buf, sizeof(buf), " %-2.2s %-8.8s", (indicator == nullptr) ? "" : indicator,
               (name == nullptr)      ? "" : name);
   os << buf;

   if(name1 != nullptr)
   {
      spxSnprintf(buf, sizeof(buf), "%-8.8s  %.15" SOPLEX_REAL_FORMAT, name1, (Real) value1);
      os << buf;

      if(name2 != nullptr)
      {
         spxSnprintf(buf, sizeof(buf), "   %-8.8s  %.15" SOPLEX_REAL_FORMAT, name2, (Real) value2);
         os << buf;
      }
   }

   os << std::endl;
}